

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)45,1ul,1ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *pJVar2;
  TTDVar pvVar3;
  undefined4 extraout_var;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)45>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar2->Result = pvVar3;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar2->VarArray[0] = pvVar3;
  iVar1 = (*reader->_vptr_FileReader[0xd])(reader,1);
  pJVar2->ScalarArray[0] = CONCAT44(extraout_var,iVar1);
  (*reader->_vptr_FileReader[5])(reader);
  return;
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(size_t i = 0; i < vcount; ++i)
            {
                vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                vAction->ScalarArray[i] = reader->ReadNakedInt64(vcount + i != 0);
            }
            reader->ReadSequenceEnd();
        }